

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_value.cpp
# Opt level: O3

bool __thiscall Am_Value::operator!=(Am_Value *this,Am_String *test_value)

{
  ushort uVar1;
  Am_String_Data *this_00;
  char *pcVar2;
  bool bVar3;
  
  uVar1 = this->type;
  bVar3 = true;
  if ((uVar1 < 10) && ((0x20cU >> (uVar1 & 0x1f) & 1) != 0)) {
    if ((this->value).wrapper_value == (Am_Wrapper *)0x0) {
      pcVar2 = Am_String::operator_cast_to_char_(test_value);
      bVar3 = pcVar2 != (char *)0x0;
    }
  }
  else if (uVar1 == 0x8008) {
    this_00 = (Am_String_Data *)(this->value).wrapper_value;
    pcVar2 = Am_String::operator_cast_to_char_(test_value);
    bVar3 = Am_String_Data::operator==(this_00,pcVar2);
    bVar3 = !bVar3;
  }
  return bVar3;
}

Assistant:

bool
Am_Value::operator!=(const Am_String &test_value) const
{
  switch (type) {
  case Am_STRING:
    return !(*(Am_String_Data *)value.wrapper_value == test_value);
  case Am_INT:
  case Am_LONG:
  case Am_VOIDPTR:
    return value.voidptr_value || (const char *)test_value;
  default:
    return true;
  }
}